

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

char * getstring_aux(lua_State *L,char *buff,char **pc)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  void *pvVar4;
  char cVar5;
  ulong uVar6;
  
  skip(pc);
  pcVar2 = *pc;
  if ((*pcVar2 == '\"') || (*pcVar2 == '\'')) {
    pcVar3 = pcVar2 + 1;
    *pc = pcVar3;
    cVar1 = *pcVar2;
    cVar5 = pcVar2[1];
    uVar6 = 0;
    if (cVar5 != cVar1) {
      uVar6 = 0;
      do {
        if (cVar5 == '\0') {
          luaL_error(L,"unfinished string in C script");
        }
        pcVar2 = *pc;
        *pc = pcVar2 + 1;
        buff[uVar6] = *pcVar2;
        uVar6 = uVar6 + 1;
        pcVar3 = *pc;
        cVar5 = *pcVar3;
      } while (cVar5 != cVar1);
    }
    *pc = pcVar3 + 1;
  }
  else {
    pcVar2 = *pc;
    cVar1 = *pcVar2;
    uVar6 = 0;
    while ((cVar1 != '\0' && (pvVar4 = memchr(" \t\n,;",(int)cVar1,6), pvVar4 == (void *)0x0))) {
      *pc = pcVar2 + 1;
      buff[uVar6] = *pcVar2;
      uVar6 = uVar6 + 1;
      pcVar2 = *pc;
      cVar1 = *pcVar2;
    }
  }
  buff[uVar6 & 0xffffffff] = '\0';
  return buff;
}

Assistant:

static const char *getstring_aux (lua_State *L, char *buff, const char **pc) {
  int i = 0;
  skip(pc);
  if (**pc == '"' || **pc == '\'') {  /* quoted string? */
    int quote = *(*pc)++;
    while (**pc != quote) {
      if (**pc == '\0') luaL_error(L, "unfinished string in C script");
      buff[i++] = *(*pc)++;
    }
    (*pc)++;
  }
  else {
    while (**pc != '\0' && !strchr(delimits, **pc))
      buff[i++] = *(*pc)++;
  }
  buff[i] = '\0';
  return buff;
}